

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlWalkRemoveRef(void *data,void *user)

{
  bool bVar1;
  xmlListPtr ref_list;
  xmlAttrPtr attr1;
  xmlAttrPtr attr0;
  void *user_local;
  void *data_local;
  
  bVar1 = *(long *)((long)data + 0x10) != *(long *)((long)user + 8);
  if (!bVar1) {
    xmlListRemoveFirst(*user,data);
  }
  data_local._4_4_ = (uint)bVar1;
  return data_local._4_4_;
}

Assistant:

static int
xmlWalkRemoveRef(const void *data, void *user)
{
    xmlAttrPtr attr0 = ((xmlRefPtr)data)->attr;
    xmlAttrPtr attr1 = ((xmlRemoveMemoPtr)user)->ap;
    xmlListPtr ref_list = ((xmlRemoveMemoPtr)user)->l;

    if (attr0 == attr1) { /* Matched: remove and terminate walk */
        xmlListRemoveFirst(ref_list, (void *)data);
        return 0;
    }
    return 1;
}